

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCreateSourceAndEvent.cpp
# Opt level: O1

void anon_unknown.dwarf_260c04::writeEvent(Session *session)

{
  __atomic_base<unsigned_long> _Var1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  SessionWriter writer;
  char local_139;
  string local_138;
  undefined1 local_118 [16];
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  uint64_t local_a8;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  SessionWriter local_60;
  
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  binlog::SessionWriter::SessionWriter(&local_60,session,0x80,0,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  if (writeEvent::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
    local_118._0_8_ = 0;
    local_118._8_2_ = info;
    local_108._M_p = (pointer)&local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"category","");
    local_e8._M_p = (pointer)&local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"writeEvent","");
    local_c8._M_p = (pointer)&local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/binlog/TestCreateSourceAndEvent.cpp"
               ,"");
    local_a8 = 0x17;
    local_a0._M_p = (pointer)&local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Hello Concurrent World","")
    ;
    local_139 = '\0';
    local_80._M_p = (pointer)&local_70;
    sVar3 = strlen(&local_139);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,&local_139,&local_139 + sVar3);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)local_60._session);
    if (iVar2 != 0) {
      uVar4 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock((pthread_mutex_t *)local_60._session);
      binlog::EventSource::~EventSource((EventSource *)local_118);
      if (local_60._channel.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60._channel.
                   super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      _Unwind_Resume(uVar4);
    }
    local_118._0_8_ = ((pthread_mutex_t *)((long)local_60._session + 0x78))->__align;
    binlog::
    serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
              ((EventSource *)local_118,
               (RecoverableVectorOutputStream *)((long)local_60._session + 0x58));
    _Var1._M_i = ((pthread_mutex_t *)((long)local_60._session + 0x78))->__align;
    ((pthread_mutex_t *)((long)local_60._session + 0x78))->__align = _Var1._M_i + 1;
    pthread_mutex_unlock((pthread_mutex_t *)local_60._session);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != &local_70) {
      operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != &local_90) {
      operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_p != &local_d8) {
      operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_p != &local_f8) {
      operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
    }
    LOCK();
    UNLOCK();
    writeEvent::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
  }
  binlog::SessionWriter::addEvent<>
            (&local_60,(uint64_t)writeEvent::_binlog_sid.super___atomic_base<unsigned_long>._M_i,0);
  if (local_60._channel.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60._channel.
               super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void writeEvent(binlog::Session& session)
{
  binlog::SessionWriter writer(session, 128);

  BINLOG_CREATE_SOURCE_AND_EVENT(writer, binlog::Severity::info, category, 0, "Hello Concurrent World");
}